

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GravityCompensationHelpers.cpp
# Opt level: O3

void __thiscall
iDynTree::GravityCompensationHelper::GravityCompensationHelper(GravityCompensationHelper *this)

{
  this->m_isModelValid = false;
  this->m_isKinematicsUpdated = false;
  iDynTree::Model::Model(&this->m_model);
  iDynTree::Traversal::Traversal(&this->m_dynamicTraversal);
  (this->m_kinematicTraversals).
  super__Vector_base<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_kinematicTraversals).
  super__Vector_base<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_kinematicTraversals).
  super__Vector_base<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iDynTree::JointPosDoubleArray::JointPosDoubleArray(&this->m_jointPos,0);
  iDynTree::JointDOFsDoubleArray::JointDOFsDoubleArray(&this->m_jointDofsZero,0);
  iDynTree::LinkVelArray::LinkVelArray(&this->m_linkVels,0);
  iDynTree::LinkAccArray::LinkAccArray(&this->m_linkProperAccs,0);
  iDynTree::LinkWrenches::LinkWrenches(&this->m_linkNetExternalWrenchesZero,0);
  iDynTree::LinkWrenches::LinkWrenches(&this->m_linkIntWrenches,0);
  iDynTree::FreeFloatingGeneralizedTorques::FreeFloatingGeneralizedTorques
            (&this->m_generalizedTorques);
  return;
}

Assistant:

GravityCompensationHelper::GravityCompensationHelper() : m_isModelValid(false),
                                                           m_isKinematicsUpdated(false),
                                                           m_model(),
                                                           m_dynamicTraversal(),
                                                           m_kinematicTraversals(),
                                                           m_jointPos(),
                                                           m_linkVels(),
                                                           m_linkProperAccs(),
                                                           m_linkNetExternalWrenchesZero(),
                                                           m_linkIntWrenches(),
                                                           m_generalizedTorques()
  {

  }